

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void FRemapTable::StaticSerializeTranslations(FSerializer *arc)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  FRemapTablePtr *this;
  FRemapTable *this_00;
  FRemapTablePtr local_40 [3];
  TAutoGrowArray<FRemapTablePtr,_FRemapTable_*> local_28;
  uint i;
  int w;
  FRemapTable *trans;
  FSerializer *arc_local;
  
  trans = (FRemapTable *)arc;
  bVar2 = FSerializer::BeginArray(arc,"translations");
  if (bVar2) {
    bVar2 = FSerializer::isWriting((FSerializer *)trans);
    if (bVar2) {
      for (local_28.super_TArray<FRemapTablePtr,_FRemapTable_*>.Most = 0;
          uVar1 = local_28.super_TArray<FRemapTablePtr,_FRemapTable_*>.Most,
          uVar3 = TArray<FRemapTablePtr,_FRemapTable_*>::Size
                            (&translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>),
          uVar1 < uVar3;
          local_28.super_TArray<FRemapTablePtr,_FRemapTable_*>.Most =
               local_28.super_TArray<FRemapTablePtr,_FRemapTable_*>.Most + 1) {
        this = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                          (ulong)local_28.super_TArray<FRemapTablePtr,_FRemapTable_*>.Most);
        _i = FRemapTablePtr::operator_cast_to_FRemapTable_(this);
        if (((_i != (FRemapTable *)0x0) && (bVar2 = IsIdentity(_i), !bVar2)) &&
           (bVar2 = FSerializer::BeginObject((FSerializer *)trans,(char *)0x0), bVar2)) {
          FSerializer::operator()
                    ((FSerializer *)trans,"index",
                     &local_28.super_TArray<FRemapTablePtr,_FRemapTable_*>.Most);
          Serialize(_i,(FSerializer *)trans);
          FSerializer::EndObject((FSerializer *)trans);
        }
      }
    }
    else {
      while (bVar2 = FSerializer::BeginObject((FSerializer *)trans,(char *)0x0), bVar2) {
        FSerializer::operator()
                  ((FSerializer *)trans,"index",
                   (int *)&local_28.super_TArray<FRemapTablePtr,_FRemapTable_*>.Count);
        TAutoGrowArray<FRemapTablePtr,_FRemapTable_*>::GetVal(&local_28,0x1ac6ca0);
        _i = FRemapTablePtr::operator_cast_to_FRemapTable_((FRemapTablePtr *)&local_28);
        if (_i == (FRemapTable *)0x0) {
          this_00 = (FRemapTable *)operator_new(0x20);
          FRemapTable(this_00,0x100);
          uVar1 = local_28.super_TArray<FRemapTablePtr,_FRemapTable_*>.Count;
          _i = this_00;
          FRemapTablePtr::FRemapTablePtr(local_40,this_00);
          TAutoGrowArray<FRemapTablePtr,_FRemapTable_*>::SetVal
                    (translationtables + 4,uVar1,local_40);
        }
        Serialize(_i,(FSerializer *)trans);
        FSerializer::EndObject((FSerializer *)trans);
      }
    }
    FSerializer::EndArray((FSerializer *)trans);
  }
  return;
}

Assistant:

void FRemapTable::StaticSerializeTranslations(FSerializer &arc)
{
	if (arc.BeginArray("translations"))
	{
		// Does this level have custom translations?
		FRemapTable *trans;
		int w;
		if (arc.isWriting())
		{
			for (unsigned int i = 0; i < translationtables[TRANSLATION_LevelScripted].Size(); ++i)
			{
				trans = translationtables[TRANSLATION_LevelScripted][i];
				if (trans != NULL && !trans->IsIdentity())
				{
					if (arc.BeginObject(nullptr))
					{
						arc("index", i);
						trans->Serialize(arc);
						arc.EndObject();
					}
				}
			}
		}
		else
		{
			while (arc.BeginObject(nullptr))
			{
				arc("index", w);
				trans = translationtables[TRANSLATION_LevelScripted].GetVal(w);
				if (trans == NULL)
				{
					trans = new FRemapTable;
					translationtables[TRANSLATION_LevelScripted].SetVal(w, trans);
				}
				trans->Serialize(arc);
				arc.EndObject();
			}
		}
		arc.EndArray();
	}
}